

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

bool dxil_spv::emit_physical_buffer_store_instruction
               (Impl *impl,CallInst *instruction,PhysicalPointerMeta *ptr_meta,uint32_t alignment)

{
  uint32_t uVar1;
  PhysicalPointerMeta *pPVar2;
  bool bVar3;
  uint8_t uVar4;
  Id base_type_id;
  uint uVar5;
  Id type_id;
  Id IVar6;
  Builder *pBVar7;
  Value *pVVar8;
  Type *element_type;
  Operation *pOVar9;
  Operation *pOVar10;
  LoggingCallback p_Var11;
  void *pvVar12;
  uint i;
  long lVar13;
  uint32_t mask;
  Op value_cast_op;
  Id physical_type_id;
  PhysicalPointerMeta tmp_ptr_meta;
  Id elems [4];
  uint32_t local_1070;
  uint32_t local_106c;
  uint local_1068;
  Id local_1064;
  PhysicalPointerMeta *local_1060;
  Op local_1058;
  Id local_1054;
  Builder *local_1050;
  PhysicalPointerMeta local_1048;
  Id local_1038 [1026];
  
  local_106c = alignment;
  pBVar7 = Converter::Impl::builder(impl);
  local_1070 = 0;
  bVar3 = get_constant_operand(&instruction->super_Instruction,8,&local_1070);
  if ((bVar3) &&
     ((local_106c != 0 ||
      (bVar3 = get_constant_operand(&instruction->super_Instruction,9,&local_106c), bVar3)))) {
    uVar1 = local_1070;
    uVar5 = 1;
    if (local_1070 != 1) {
      if (local_1070 == 3) {
        uVar5 = 2;
      }
      else if (local_1070 == 0xf) {
        uVar5 = 4;
      }
      else {
        if (local_1070 != 7) {
          p_Var11 = get_thread_log_callback();
          if (p_Var11 != (LoggingCallback)0x0) {
            snprintf((char *)local_1038,0x1000,"Unexpected mask for RawBufferStore = %u.\n",
                     (ulong)local_1070);
            pvVar12 = get_thread_log_callback_userdata();
            (*p_Var11)(pvVar12,Error,(char *)local_1038);
            return false;
          }
          emit_physical_buffer_store_instruction();
          goto LAB_00178703;
        }
        uVar5 = 3;
      }
    }
    local_1060 = ptr_meta;
    local_1050 = pBVar7;
    pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
    element_type = LLVMBC::Value::getType(pVVar8);
    local_1064 = build_vectorized_physical_load_store_access(impl,instruction,uVar5,element_type);
    get_physical_load_store_cast_info(impl,element_type,&local_1054,&local_1058);
    base_type_id = local_1054;
    local_1068 = uVar5;
    if (uVar1 != 1) {
      base_type_id = spv::Builder::makeVectorType(local_1050,local_1054,uVar5);
    }
    IVar6 = local_1064;
    local_1048.size = local_1060->size;
    local_1048.nonwritable = local_1060->nonwritable;
    local_1048.nonreadable = local_1060->nonreadable;
    local_1048.coherent = local_1060->coherent;
    local_1048.rov = local_1060->rov;
    local_1048.stride = local_1060->stride;
    local_1048._5_3_ = *(undefined3 *)&local_1060->field_0x5;
    if (local_1064 == 0) {
      uVar4 = '\0';
    }
    else {
      uVar5 = get_type_scalar_alignment(impl,element_type);
      uVar4 = (char)uVar5 * (char)local_1068;
    }
    local_1048.stride = uVar4;
    type_id = Converter::Impl::get_physical_pointer_block_type(impl,base_type_id,&local_1048);
    if (IVar6 == 0) {
      IVar6 = build_physical_pointer_address_for_raw_load_store(impl,instruction);
    }
    else {
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
    }
    emit_buffer_synchronization_validation(impl,instruction,Store);
    pOVar9 = Converter::Impl::allocate(impl,OpBitcast,type_id);
    Operation::add_id(pOVar9,IVar6);
    Converter::Impl::add(impl,pOVar9,false);
    pBVar7 = local_1050;
    IVar6 = spv::Builder::makePointer(local_1050,StorageClassPhysicalStorageBuffer,base_type_id);
    pOVar10 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar6);
    Operation::add_id(pOVar10,pOVar9->id);
    IVar6 = spv::Builder::makeIntegerType(pBVar7,0x20,false);
    IVar6 = spv::Builder::makeIntConstant(pBVar7,IVar6,0,false);
    Operation::add_id(pOVar10,IVar6);
    if (local_1064 != 0) {
      Operation::add_id(pOVar10,local_1064);
    }
    lVar13 = 0;
    Converter::Impl::add(impl,pOVar10,false);
    local_1038[0] = 0;
    local_1038[1] = 0;
    local_1038[2] = 0;
    local_1038[3] = 0;
    do {
      uVar5 = (int)lVar13 + 4;
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar5);
      Converter::Impl::register_externally_visible_write(impl,pVVar8);
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar5);
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
      local_1038[lVar13] = IVar6;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    pOVar9 = Converter::Impl::allocate(impl,OpStore);
    Operation::add_id(pOVar9,pOVar10->id);
    IVar6 = Converter::Impl::build_vector(impl,local_1054,local_1038,local_1068);
    if (local_1058 != OpNop) {
      pOVar10 = Converter::Impl::allocate(impl,local_1058,base_type_id);
      Operation::add_id(pOVar10,IVar6);
      Converter::Impl::add(impl,pOVar10,false);
      IVar6 = pOVar10->id;
    }
    pPVar2 = local_1060;
    Operation::add_id(pOVar9,IVar6);
    Operation::add_literal(pOVar9,2);
    Operation::add_literal(pOVar9,local_106c);
    Converter::Impl::add(impl,pOVar9,pPVar2->rov);
    bVar3 = true;
  }
  else {
LAB_00178703:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool emit_physical_buffer_store_instruction(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                   const Converter::Impl::PhysicalPointerMeta &ptr_meta,
                                                   uint32_t alignment = 0)
{
	auto &builder = impl.builder();

	uint32_t mask = 0;
	if (!get_constant_operand(instruction, 8, &mask))
		return false;

	if (alignment == 0 && !get_constant_operand(instruction, 9, &alignment))
		return false;

	unsigned vecsize = 0;
	if (mask == 1)
		vecsize = 1;
	else if (mask == 3)
		vecsize = 2;
	else if (mask == 7)
		vecsize = 3;
	else if (mask == 15)
		vecsize = 4;
	else
	{
		LOGE("Unexpected mask for RawBufferStore = %u.\n", mask);
		return false;
	}

	auto *element_type = instruction->getOperand(4)->getType();

	// If we can express this as a plain access chain, do so for clarity and ideally better perf.
	// If we cannot do it trivially, fallback to raw pointer arithmetic.
	spv::Id array_id = build_vectorized_physical_load_store_access(impl, instruction, vecsize, element_type);

	spv::Id physical_type_id;
	spv::Op value_cast_op;
	get_physical_load_store_cast_info(impl, element_type, physical_type_id, value_cast_op);

	spv::Id vec_type_id = physical_type_id;
	if (vecsize > 1)
		vec_type_id = builder.makeVectorType(physical_type_id, vecsize);

	auto tmp_ptr_meta = ptr_meta;
	tmp_ptr_meta.stride = array_id ? vecsize * get_type_scalar_alignment(impl, element_type) : 0;
	spv::Id ptr_type_id = impl.get_physical_pointer_block_type(vec_type_id, tmp_ptr_meta);

	spv::Id u64_ptr_id;
	if (array_id)
		u64_ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	else
		u64_ptr_id = build_physical_pointer_address_for_raw_load_store(impl, instruction);

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Store);

	auto *ptr_bitcast_op = impl.allocate(spv::OpBitcast, ptr_type_id);
	ptr_bitcast_op->add_id(u64_ptr_id);
	impl.add(ptr_bitcast_op);

	auto *chain_op = impl.allocate(spv::OpInBoundsAccessChain,
								   builder.makePointer(spv::StorageClassPhysicalStorageBuffer, vec_type_id));
	chain_op->add_id(ptr_bitcast_op->id);
	chain_op->add_id(builder.makeUintConstant(0));
	if (array_id)
		chain_op->add_id(array_id);
	impl.add(chain_op);

	spv::Id elems[4] = {};
	for (unsigned i = 0; i < 4; i++)
	{
		impl.register_externally_visible_write(instruction->getOperand(4 + i));
		elems[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
	}

	auto *store_op = impl.allocate(spv::OpStore);
	store_op->add_id(chain_op->id);

	spv::Id vec_id = impl.build_vector(physical_type_id, elems, vecsize);
	if (value_cast_op != spv::OpNop)
	{
		auto *op = impl.allocate(value_cast_op, vec_type_id);
		op->add_id(vec_id);
		impl.add(op);
		vec_id = op->id;
	}

	store_op->add_id(vec_id);
	store_op->add_literal(spv::MemoryAccessAlignedMask);
	store_op->add_literal(alignment);

	impl.add(store_op, ptr_meta.rov);

	return true;
}